

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::constructAggregate
          (TParseContext *this,TIntermNode *node,TType *type,int paramCount,TSourceLoc *loc)

{
  TIntermediate *pTVar1;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  TIntermTyped *pTVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *this_00;
  TPoolAllocator *pTVar5;
  char *__end;
  undefined1 in_stack_fffffffffffffeb8 [12];
  undefined8 in_stack_fffffffffffffed0;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 local_108 [16];
  TPoolAllocator *local_f8;
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  TPoolAllocator *local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  TPoolAllocator *local_a8;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  TString local_80;
  TString local_58;
  
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar3 = (*node->_vptr_TIntermNode[3])(node);
  pTVar4 = TIntermediate::addConversion
                     (pTVar1,EOpConstructStruct,type,(TIntermTyped *)CONCAT44(extraout_var,iVar3));
  if (pTVar4 != (TIntermTyped *)0x0) {
    iVar3 = (*(pTVar4->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar4);
    bVar2 = TType::operator==((TType *)CONCAT44(extraout_var_00,iVar3),type);
    if (bVar2) {
      return pTVar4;
    }
  }
  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  bVar2 = (bool)(pTVar1->source == EShSourceGlsl & pTVar1->enhancedMsgs);
  iVar3 = (*node->_vptr_TIntermNode[3])(node);
  this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0xf0))
                               ((long *)CONCAT44(extraout_var_01,iVar3));
  pTVar5 = GetThreadPoolAllocator();
  puVar6 = local_108;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
             &stack0xfffffffffffffee0,"","");
  local_a8 = GetThreadPoolAllocator();
  local_a0 = local_90;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_a8,""
             ,"");
  name._M_dataplus._M_p = (pointer)&local_a8;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xfffffffffffffee0;
  name._16_12_ = in_stack_fffffffffffffeb8;
  name.field_2._M_allocated_capacity._4_4_ = paramCount;
  name.field_2._8_8_ = type;
  structName._M_dataplus._M_p = (pointer)loc;
  structName._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)in_stack_fffffffffffffed0;
  structName._M_string_length = (size_type)pTVar5;
  structName.field_2._M_allocated_capacity = (size_type)puVar6;
  structName.field_2._8_8_ = in_stack_fffffffffffffef0;
  TType::getCompleteString(&local_58,this_00,bVar2,true,true,true,name,structName);
  local_d0 = GetThreadPoolAllocator();
  local_c8 = local_b8;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_d0,""
             ,"");
  local_f8 = GetThreadPoolAllocator();
  local_f0 = local_e0;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_f8,""
             ,"");
  name_00._M_dataplus._M_p = (pointer)&local_f8;
  name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_d0;
  name_00._16_12_ = in_stack_fffffffffffffeb8;
  name_00.field_2._M_allocated_capacity._4_4_ = paramCount;
  name_00.field_2._8_8_ = type;
  structName_00._M_dataplus._M_p = (pointer)loc;
  structName_00._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)local_58._M_dataplus._M_p;
  structName_00._M_string_length = (size_type)pTVar5;
  structName_00.field_2._M_allocated_capacity = (size_type)puVar6;
  structName_00.field_2._8_8_ = in_stack_fffffffffffffef0;
  TType::getCompleteString(&local_80,type,bVar2,true,true,true,name_00,structName_00);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"","constructor","cannot convert parameter %d from \'%s\' to \'%s\'",
             (ulong)(uint)paramCount,local_58._M_dataplus._M_p,local_80._M_dataplus._M_p);
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* TParseContext::constructAggregate(TIntermNode* node, const TType& type, int paramCount, const TSourceLoc& loc)
{
    TIntermTyped* converted = intermediate.addConversion(EOpConstructStruct, type, node->getAsTyped());
    if (! converted || converted->getType() != type) {
        bool enhanced = intermediate.getEnhancedMsgs();
        error(loc, "", "constructor", "cannot convert parameter %d from '%s' to '%s'", paramCount,
              node->getAsTyped()->getType().getCompleteString(enhanced).c_str(), type.getCompleteString(enhanced).c_str());

        return nullptr;
    }

    return converted;
}